

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O3

QMap<int,_QByteArray> parseTzAbbreviations(QDataStream *ds,int tzh_charcnt,QList<QTzType> *types)

{
  long lVar1;
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_>
  QVar2;
  char ch_00;
  Status SVar3;
  QByteArray *this;
  undefined1 in_CL;
  byte bVar4;
  undefined7 in_register_00000009;
  uint uVar5;
  ulong uVar6;
  undefined4 in_register_00000034;
  QDataStream *this_00;
  long lVar7;
  long in_FS_OFFSET;
  quint8 ch;
  uint local_7c;
  QByteArray local_78;
  QByteArray local_58;
  qint8 local_39;
  totally_ordered_wrapper<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_*>
  local_38;
  
  this_00 = (QDataStream *)CONCAT44(in_register_00000034,tzh_charcnt);
  local_38.ptr = *(QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
                   **)(in_FS_OFFSET + 0x28);
  ds->d = (void *)0x0;
  local_39 = -0x56;
  local_58.d.size = 0;
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char *)0x0;
  if (0 < (int)types) {
    uVar6 = (ulong)types & 0xffffffff;
    do {
      SVar3 = QDataStream::status(this_00);
      if (SVar3 != Ok) break;
      QDataStream::operator>>(this_00,&local_39);
      SVar3 = QDataStream::status(this_00);
      if (SVar3 != Ok) goto LAB_003fc5e9;
      QByteArray::append(&local_58,local_39);
      uVar5 = (int)uVar6 - 1;
      uVar6 = (ulong)uVar5;
    } while (uVar5 != 0);
  }
  lVar1 = *(long *)(CONCAT71(in_register_00000009,in_CL) + 0x10);
  if (lVar1 != 0) {
    lVar7 = *(long *)(CONCAT71(in_register_00000009,in_CL) + 8);
    lVar1 = lVar7 + lVar1 * 8;
    do {
      local_78.d.d = (Data *)0x0;
      local_78.d.ptr = (char *)0x0;
      local_78.d.size = 0;
      bVar4 = *(byte *)(lVar7 + 5);
      uVar6 = (ulong)bVar4;
      ch_00 = local_58.d.ptr[uVar6];
      if (ch_00 != '\0') {
        do {
          uVar6 = uVar6 + 1;
          QByteArray::append(&local_78,ch_00);
          ch_00 = local_58.d.ptr[uVar6];
        } while (ch_00 != '\0');
        bVar4 = *(byte *)(lVar7 + 5);
      }
      local_7c = (uint)bVar4;
      this = QMap<int,_QByteArray>::operator[]((QMap<int,_QByteArray> *)ds,(int *)&local_7c);
      QByteArray::operator=(this,&local_78);
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
        }
      }
      lVar7 = lVar7 + 8;
    } while (lVar7 != lVar1);
  }
LAB_003fc5e9:
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
    }
  }
  QVar2.d.ptr = (totally_ordered_wrapper<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_*>
                 )((totally_ordered_wrapper<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_*>
                    *)(in_FS_OFFSET + 0x28))->ptr;
  if (QVar2.d.ptr !=
      (totally_ordered_wrapper<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_*>
       )local_38.ptr) {
    __stack_chk_fail();
  }
  return (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_>
          )(QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_>
            )QVar2.d.ptr;
}

Assistant:

static QMap<int, QByteArray> parseTzAbbreviations(QDataStream &ds, int tzh_charcnt, const QList<QTzType> &types)
{
    // Parse the abbreviation list which is tzh_charcnt long with '\0' separated strings. The
    // QTzType.tz_abbrind index points to the first char of the abbreviation in the array, not the
    // occurrence in the list. It can also point to a partial string so we need to use the actual typeList
    // index values when parsing.  By using a map with tz_abbrind as ordered key we get both index
    // methods in one data structure and can convert the types afterwards.
    QMap<int, QByteArray> map;
    quint8 ch;
    QByteArray input;
    // First parse the full abbrev string
    for (int i = 0; i < tzh_charcnt && ds.status() == QDataStream::Ok; ++i) {
        ds >> ch;
        if (ds.status() == QDataStream::Ok)
            input.append(char(ch));
        else
            return map;
    }
    // Then extract all the substrings pointed to by types
    for (const QTzType &type : types) {
        QByteArray abbrev;
        for (int i = type.tz_abbrind; input.at(i) != '\0'; ++i)
            abbrev.append(input.at(i));
        // Have reached end of an abbreviation, so add to map
        map[type.tz_abbrind] = abbrev;
    }
    return map;
}